

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O0

chunk_t_conflict1 GET_CHUNK_MAG(uint8_t *buf,uint32_t *chunk_rem,uint32_t dist)

{
  uint in_EDX;
  undefined4 *in_RSI;
  void *in_RDI;
  uint8_t *cur_chunk;
  chunk_t_conflict1 chunk_load;
  uint64_t bytes_remaining;
  uint64_t cpy_dist;
  size_t local_40;
  chunk_t_conflict1 *local_38;
  chunk_t_conflict1 local_30;
  ulong local_28;
  size_t local_20;
  uint local_14;
  undefined4 *local_10;
  void *local_8;
  
  local_28 = 8;
  local_38 = &local_30;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while (local_28 != 0) {
    if (local_28 < local_14) {
      local_40 = local_28;
    }
    else {
      local_40 = (size_t)local_14;
    }
    local_20 = local_40;
    memcpy(local_38,local_8,local_40);
    local_28 = local_28 - local_20;
    local_38 = (chunk_t_conflict1 *)(local_20 + (long)local_38);
    *local_10 = (int)local_20;
  }
  return local_30;
}

Assistant:

static inline chunk_t GET_CHUNK_MAG(uint8_t *buf, uint32_t *chunk_rem, uint32_t dist) {
        /* This code takes string of length dist from "from" and repeats
         * it for as many times as can fit in a chunk_t (vector register) */
        uint64_t cpy_dist;
        uint64_t bytes_remaining = sizeof(chunk_t);
        chunk_t chunk_load;
        uint8_t *cur_chunk = (uint8_t *)&chunk_load;
        while (bytes_remaining) {
            cpy_dist = MIN(dist, bytes_remaining);
            memcpy(cur_chunk, buf, (size_t)cpy_dist);
            bytes_remaining -= cpy_dist;
            cur_chunk += cpy_dist;
            /* This allows us to bypass an expensive integer division since we're effectively
             * counting in this loop, anyway */
            *chunk_rem = (uint32_t)cpy_dist;
        }

        return chunk_load;
}